

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O0

void decode_fglrx_ioctl_54(fglrx_ioctl_54 *d)

{
  int iVar1;
  fglrx_ioctl_54 *d_local;
  
  if ((d->unk00 != 0) || (iVar1 = _fglrx_field_enabled("unk00"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx,(ulong)d->unk00);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk04 != 0) || (iVar1 = _fglrx_field_enabled("unk04"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk04: 0x%08x",fglrx_pfx,(ulong)d->unk04);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk08 != 0) || (iVar1 = _fglrx_field_enabled("unk08"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk08: 0x%08x",fglrx_pfx,(ulong)d->unk08);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk0c != 0) || (iVar1 = _fglrx_field_enabled("unk0c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk0c: 0x%08x",fglrx_pfx,(ulong)d->unk0c);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk10 != 0) || (iVar1 = _fglrx_field_enabled("unk10"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk10: 0x%08x",fglrx_pfx,(ulong)d->unk10);
  }
  fglrx_pfx = fglrx_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_54(struct fglrx_ioctl_54 *d)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	fglrx_print_x32(d, unk10);
	mmt_log_cont_nl();
}